

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# 7zArcIn.c
# Opt level: O0

void SzArEx_Init(CSzArEx *p)

{
  CSzAr *in_RDI;
  
  SzAr_Init(in_RDI);
  *(undefined4 *)&in_RDI[1].FolderCRCs.Defs = 0;
  in_RDI[1].PackPositions = (UInt64 *)0x0;
  in_RDI[1].FolderCRCs.Vals = (UInt32 *)0x0;
  in_RDI[1].FoCodersOffsets = (size_t *)0x0;
  in_RDI[2].FolderCRCs.Vals = (UInt32 *)0x0;
  in_RDI[2].FoCodersOffsets = (size_t *)0x0;
  in_RDI[2].FoStartPackStreamIndex = (UInt32 *)0x0;
  in_RDI[2].FoToCoderUnpackSizes = (UInt32 *)0x0;
  in_RDI[1].FoStartPackStreamIndex = (UInt32 *)0x0;
  in_RDI[1].FoToCoderUnpackSizes = (UInt32 *)0x0;
  in_RDI[1].FoToMainUnpackSizeIndex = (Byte *)0x0;
  in_RDI[1].CoderUnpackSizes = (UInt64 *)0x0;
  in_RDI[1].CodersData = (Byte *)0x0;
  in_RDI[2].NumPackStreams = 0;
  in_RDI[2].NumFolders = 0;
  in_RDI[2].PackPositions = (UInt64 *)0x0;
  in_RDI[2].FolderCRCs.Defs = (Byte *)0x0;
  return;
}

Assistant:

void SzArEx_Init(CSzArEx *p)
{
  SzAr_Init(&p->db);
  
  p->NumFiles = 0;
  p->dataPos = 0;
  
  p->UnpackPositions = NULL;
  p->IsDirs = NULL;
  
  p->FolderToFile = NULL;
  p->FileToFolder = NULL;
  
  p->FileNameOffsets = NULL;
  p->FileNames = NULL;
  
  SzBitUi32s_Init(&p->CRCs);
  SzBitUi32s_Init(&p->Attribs);
  // SzBitUi32s_Init(&p->Parents);
  SzBitUi64s_Init(&p->MTime);
  SzBitUi64s_Init(&p->CTime);
}